

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource_private.hh
# Opt level: O2

ssize_t __thiscall
InputSource::read_abi_cxx11_(InputSource *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  
  this->_vptr_InputSource = (_func_int **)this->buffer;
  std::__cxx11::string::_M_construct((ulong)this,(char)__buf);
  read((InputSource *)CONCAT44(in_register_00000034,__fd),(int)this,__buf,__nbytes);
  return (ssize_t)this;
}

Assistant:

inline std::string
InputSource::read(size_t count, qpdf_offset_t at)
{
    std::string result(count, '\0');
    (void)read(result, count, at);
    return result;
}